

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

void __thiscall google::protobuf::io::CodedInputStream::~CodedInputStream(CodedInputStream *this)

{
  LogMessage *pLVar1;
  LogFinisher local_41;
  LogMessage local_40;
  
  if (this->input_ != (ZeroCopyInputStream *)0x0) {
    BackUpInputToCurrentPosition(this);
  }
  if (this->total_bytes_warning_threshold_ == -2) {
    internal::LogMessage::LogMessage
              (&local_40,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/io/coded_stream.cc"
               ,0x4e);
    pLVar1 = internal::LogMessage::operator<<(&local_40,"The total number of bytes read was ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1,this->total_bytes_read_);
    internal::LogFinisher::operator=(&local_41,pLVar1);
    internal::LogMessage::~LogMessage(&local_40);
  }
  return;
}

Assistant:

CodedInputStream::~CodedInputStream() {
  if (input_ != NULL) {
    BackUpInputToCurrentPosition();
  }

  if (total_bytes_warning_threshold_ == -2) {
    GOOGLE_LOG(WARNING) << "The total number of bytes read was " << total_bytes_read_;
  }
}